

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clReleaseCommandBufferKHR(cl_command_buffer_khr command_buffer)

{
  atomic<unsigned_long> *paVar1;
  ulong enqueueCounter;
  CLIntercept *this;
  byte bVar2;
  cl_uint cVar3;
  cl_int errorCode;
  CLdispatchX *pCVar4;
  time_point end;
  undefined8 in_stack_ffffffffffffff98;
  cl_command_buffer_khr p_Var5;
  undefined4 uVar6;
  allocator local_59;
  time_point local_58;
  string local_50;
  
  this = g_pIntercept;
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x472;
  }
  pCVar4 = CLIntercept::dispatchX(g_pIntercept,command_buffer);
  if (pCVar4->clReleaseCommandBufferKHR == (_func_cl_int_cl_command_buffer_khr *)0x0) {
    return -0x472;
  }
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  bVar2 = (this->m_Config).CallLogging;
  cVar3 = 0;
  if ((bool)bVar2 == true) {
    cVar3 = CLIntercept::getRefCount(this,command_buffer);
    bVar2 = (this->m_Config).CallLogging;
  }
  if ((bVar2 & 1) != 0) {
    p_Var5 = command_buffer;
    CLIntercept::callLoggingEnter
              (this,"clReleaseCommandBufferKHR",enqueueCounter,(cl_kernel)0x0,
               "[ ref count = %d ] command_buffer = %p",(ulong)cVar3,command_buffer);
    uVar6 = (undefined4)((ulong)p_Var5 >> 0x20);
  }
  CLIntercept::checkRemoveCommandBufferInfo(this,command_buffer);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_58.__d.__r = (duration)0;
  }
  else {
    local_58.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pCVar4->clReleaseCommandBufferKHR)(command_buffer);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_50,"",&local_59);
      CLIntercept::updateHostTimingStats(this,"clReleaseCommandBufferKHR",&local_50,local_58,end);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((bool)bVar2 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_00138e68;
    }
    else if (errorCode == 0) goto LAB_00138e3f;
  }
  else {
    if (errorCode == 0) {
LAB_00138e3f:
      errorCode = 0;
      goto LAB_00138e68;
    }
    CLIntercept::logError(this,"clReleaseCommandBufferKHR",errorCode);
    bVar2 = (this->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_00138e68:
  if ((command_buffer != (cl_command_buffer_khr)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    paVar1 = &(this->m_ObjectTracker).m_CommandBuffers.NumReleases;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clReleaseCommandBufferKHR",errorCode,(cl_event *)0x0,(cl_sync_point_khr *)0x0,
               "[ ref count = %d ]",CONCAT44(uVar6,cVar3 - 1));
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_50,"",&local_59);
    CLIntercept::chromeCallLoggingExit
              (this,"clReleaseCommandBufferKHR",&local_50,false,0,local_58,end);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clReleaseCommandBufferKHR(
    cl_command_buffer_khr command_buffer)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clReleaseCommandBufferKHR )
        {
            GET_ENQUEUE_COUNTER();

            cl_uint ref_count =
                pIntercept->config().CallLogging ?
                pIntercept->getRefCount( command_buffer ) : 0;
            CALL_LOGGING_ENTER( "[ ref count = %d ] command_buffer = %p",
                ref_count,
                command_buffer );
            pIntercept->checkRemoveCommandBufferInfo( command_buffer );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clReleaseCommandBufferKHR(
                command_buffer );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            ADD_OBJECT_RELEASE( command_buffer );
            CALL_LOGGING_EXIT( retVal, "[ ref count = %d ]", --ref_count );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}